

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfs.c
# Opt level: O1

lws_plat_file_ops * lws_vfs_select_fops(lws_plat_file_ops *fops,char *vfs_path,char **vpath)

{
  char *__s2;
  int iVar1;
  ulong uVar2;
  long lVar3;
  lws_plat_file_ops *plVar4;
  char *pcVar5;
  
  *vpath = (char *)0x0;
  pcVar5 = vfs_path;
  if (vfs_path == (char *)0x0 || fops->next == (lws_plat_file_ops *)0x0) {
    return fops;
  }
  do {
    if (*pcVar5 == '/') {
      for (plVar4 = fops->next; plVar4 != (lws_plat_file_ops *)0x0; plVar4 = plVar4->next) {
        lVar3 = 0x30;
        do {
          __s2 = *(char **)((long)(plVar4->fi + -3) + lVar3);
          if (__s2 == (char *)0x0) break;
          uVar2 = (ulong)*(byte *)((long)plVar4->fi + lVar3 + -0x28);
          if ((vfs_path + uVar2 <= pcVar5) &&
             (iVar1 = strncmp(pcVar5 + (1 - uVar2),__s2,uVar2 - 1), iVar1 == 0)) {
            *vpath = pcVar5 + 1;
            return plVar4;
          }
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0x60);
      }
    }
    else if (*pcVar5 == '\0') {
      return fops;
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

const struct lws_plat_file_ops *
lws_vfs_select_fops(const struct lws_plat_file_ops *fops, const char *vfs_path,
		    const char **vpath)
{
	const struct lws_plat_file_ops *pf;
	const char *p = vfs_path;
	int n;

	*vpath = NULL;

	/* no non-platform fops, just use that */

	if (!fops->next)
		return fops;

	/*
	 *  scan the vfs path looking for indications we are to be
	 * handled by a specific fops
	 */

	while (p && *p) {
		if (*p != '/') {
			p++;
			continue;
		}
		/* the first one is always platform fops, so skip */
		pf = fops->next;
		while (pf) {
			n = 0;
			while (n < (int)LWS_ARRAY_SIZE(pf->fi) && pf->fi[n].sig) {
				if (p >= vfs_path + pf->fi[n].len)
					if (!strncmp(p - (pf->fi[n].len - 1),
						     pf->fi[n].sig,
						     pf->fi[n].len - 1)) {
						*vpath = p + 1;
						return pf;
					}

				n++;
			}
			pf = pf->next;
		}
		p++;
	}

	return fops;
}